

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Bio.cpp
# Opt level: O0

bool __thiscall axl::cry::Bio::createMemBuf(Bio *this,void *p,size_t size)

{
  bool bVar1;
  BIO *pBVar2;
  int in_EDX;
  void *in_RSI;
  Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_> *in_RDI;
  
  sl::Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>::close(in_RDI,(int)in_RSI);
  pBVar2 = BIO_new_mem_buf(in_RSI,in_EDX);
  in_RDI->m_h = (bio_st *)pBVar2;
  bVar1 = completeWithLastCryptoError(0);
  return bVar1;
}

Assistant:

bool
Bio::createMemBuf(
	const void* p,
	size_t size
) {
	close();
	m_h = BIO_new_mem_buf((void*)p, size);
	return completeWithLastCryptoError(m_h != NULL);
}